

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O1

void __thiscall
xemmai::t_value<xemmai::t_pointer>::f_put
          (t_value<xemmai::t_pointer> *this,t_object *a_key,size_t *a_index,
          t_value<xemmai::t_pointer> *a_value)

{
  t_object *a_this;
  t_type_of<xemmai::t_object> *this_00;
  ulong uVar1;
  wstring_view a_message;
  
  a_this = (this->super_t_pointer).v_p;
  if (a_this < (t_object *)0x5) {
    a_message._M_str = (wchar_t *)a_key;
    a_message._M_len = (size_t)L"not supported.";
    f_throw((xemmai *)0xe,a_message);
  }
  this_00 = a_this->v_type;
  uVar1 = *a_index;
  if ((uVar1 < this_00->v_instance_fields) &&
     ((&this_00[1].v_this)[uVar1 * 3].v_p._M_b._M_p == a_key)) {
    t_value<xemmai::t_slot>::operator=
              ((t_value<xemmai::t_slot> *)
               (a_this->v_data + uVar1 * 0x10 + this_00->v_fields_offset + -0x48),a_value);
    return;
  }
  t_type_of<xemmai::t_object>::f__put(this_00,a_this,a_key,a_index,a_value);
  return;
}

Assistant:

void f_put(t_object* a_key, size_t& a_index, const t_value<t_pointer>& a_value) const
	{
		auto p = f_object_or_throw();
		p->f_type()->f_put(p, a_key, a_index, a_value);
	}